

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_entropy.c
# Opt level: O2

MPP_RET vp8e_write_entropy_tables(void *hal)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  RK_U32 *buf;
  long lVar4;
  long lVar5;
  RK_U32 bytes;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  lVar1 = *(long *)((long)hal + 0x60);
  puVar2 = (undefined8 *)
           mpp_buffer_get_ptr_with_caller(*(MppBuffer *)(lVar1 + 0x30),"vp8e_write_entropy_tables");
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[3] = 0;
  puVar2[4] = 0;
  puVar2[5] = 0;
  puVar2[6] = 0;
  *(undefined1 *)puVar2 = *(undefined1 *)((long)hal + 0x524);
  *(undefined1 *)((long)puVar2 + 1) = *(undefined1 *)((long)hal + 0x528);
  *(undefined1 *)((long)puVar2 + 2) = *(undefined1 *)((long)hal + 0x52c);
  *(undefined1 *)((long)puVar2 + 3) = *(undefined1 *)((long)hal + 0x530);
  *(undefined1 *)((long)puVar2 + 4) = *(undefined1 *)((long)hal + 0x3630);
  *(undefined1 *)((long)puVar2 + 5) = *(undefined1 *)((long)hal + 0x3634);
  *(undefined1 *)((long)puVar2 + 6) = *(undefined1 *)((long)hal + 0x3638);
  *(undefined1 *)(puVar2 + 1) = *(undefined1 *)((long)hal + 0x544);
  *(undefined1 *)((long)puVar2 + 9) = *(undefined1 *)((long)hal + 0x548);
  *(undefined1 *)((long)puVar2 + 10) = *(undefined1 *)((long)hal + 0x54c);
  *(undefined1 *)((long)puVar2 + 0xb) = *(undefined1 *)((long)hal + 0x550);
  *(undefined1 *)((long)puVar2 + 0xc) = *(undefined1 *)((long)hal + 0x560);
  *(undefined1 *)((long)puVar2 + 0xd) = *(undefined1 *)((long)hal + 0x564);
  *(undefined1 *)((long)puVar2 + 0xe) = *(undefined1 *)((long)hal + 0x568);
  *(undefined1 *)(puVar2 + 2) = *(undefined1 *)((long)hal + 0x34fc);
  *(undefined1 *)((long)puVar2 + 0x11) = *(undefined1 *)((long)hal + 0x34b0);
  *(undefined1 *)((long)puVar2 + 0x12) = *(undefined1 *)((long)hal + 0x3500);
  *(undefined1 *)((long)puVar2 + 0x13) = *(undefined1 *)((long)hal + 0x34b4);
  *(undefined1 *)((long)puVar2 + 0x14) = *(undefined1 *)((long)hal + 0x3540);
  *(undefined1 *)((long)puVar2 + 0x15) = *(undefined1 *)((long)hal + 0x3544);
  *(undefined1 *)((long)puVar2 + 0x16) = *(undefined1 *)((long)hal + 0x34f4);
  *(undefined1 *)((long)puVar2 + 0x17) = *(undefined1 *)((long)hal + 0x34f8);
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    *(undefined1 *)((long)puVar2 + lVar4 + 0x18) = *(undefined1 *)((long)hal + lVar4 * 4 + 0x3520);
  }
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    *(undefined1 *)((long)puVar2 + lVar4 + 0x20) = *(undefined1 *)((long)hal + lVar4 * 4 + 0x34d4);
  }
  for (lVar4 = 0; lVar4 != 7; lVar4 = lVar4 + 1) {
    *(undefined1 *)((long)puVar2 + lVar4 + 0x28) = *(undefined1 *)((long)hal + lVar4 * 4 + 0x3504);
  }
  for (lVar4 = 0; lVar4 != 7; lVar4 = lVar4 + 1) {
    *(undefined1 *)((long)puVar2 + lVar4 + 0x30) = *(undefined1 *)((long)hal + lVar4 * 4 + 0x34b8);
  }
  if (*(int *)((long)hal + 0x362c) != 0) {
    puVar2 = puVar2 + 7;
    lVar4 = (long)hal + 0x13a0;
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      lVar6 = lVar4;
      for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
        lVar8 = lVar6;
        for (lVar9 = 0; lVar10 = -0xc, puVar3 = puVar2, lVar9 != 3; lVar9 = lVar9 + 1) {
          for (; puVar2 = (undefined8 *)((long)puVar3 + 1), lVar10 != 0; lVar10 = lVar10 + 4) {
            *(undefined1 *)puVar3 = *(undefined1 *)(lVar8 + 0xc + lVar10);
            puVar3 = puVar2;
          }
          *(undefined1 *)puVar3 = 0;
          lVar8 = lVar8 + 0x2c;
        }
        lVar6 = lVar6 + 0x84;
      }
      lVar4 = lVar4 + 0x420;
    }
    lVar4 = (long)hal + 0x13b0;
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      lVar6 = lVar4;
      for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
        lVar8 = lVar6;
        for (lVar9 = 0; lVar10 = -0x1c, puVar3 = puVar2, lVar9 != 3; lVar9 = lVar9 + 1) {
          for (; puVar2 = (undefined8 *)((long)puVar3 + 1), lVar10 != 0; lVar10 = lVar10 + 4) {
            *(undefined1 *)puVar3 = *(undefined1 *)(lVar8 + 0x1c + lVar10);
            puVar3 = puVar2;
          }
          *(undefined1 *)puVar3 =
               *(undefined1 *)
                (lVar9 * 0x2c + 0xc + lVar7 * 0x84 + lVar5 * 0x420 + (long)hal + 0x13a0);
          lVar8 = lVar8 + 0x2c;
        }
        lVar6 = lVar6 + 0x84;
      }
      lVar4 = lVar4 + 0x420;
    }
  }
  buf = (RK_U32 *)
        mpp_buffer_get_ptr_with_caller(*(MppBuffer *)(lVar1 + 0x30),"vp8e_write_entropy_tables");
  bytes = 0x4b8;
  if (*(int *)((long)hal + 0x362c) == 0) {
    bytes = 0x38;
  }
  vp8e_swap_endian(buf,bytes);
  mpp_buffer_sync_end_f(*(MppBuffer *)(lVar1 + 0x30),0,"vp8e_write_entropy_tables");
  return MPP_OK;
}

Assistant:

MPP_RET vp8e_write_entropy_tables(void *hal)
{
    HalVp8eCtx *ctx = (HalVp8eCtx *)hal;

    Vp8eVpuBuf *buffers = (Vp8eVpuBuf *)ctx->buffers;
    Vp8eHalEntropy *entropy = &ctx->entropy;

    RK_U8 *table = (RK_U8 *)mpp_buffer_get_ptr(buffers->hw_cabac_table_buf);
    /* Write probability tables to ASIC linear memory, reg + mem */
    memset(table, 0, 56);  // use 56 bytes
    table[0] = entropy->skip_false_prob;
    table[1] = entropy->intra_prob;
    table[2] = entropy->last_prob;
    table[3] = entropy->gf_prob;
    table[4] = entropy->segment_prob[0];
    table[5] = entropy->segment_prob[1];
    table[6] = entropy->segment_prob[2];

    table[8]  = entropy->y_mode_prob[0];
    table[9]  = entropy->y_mode_prob[1];
    table[10] = entropy->y_mode_prob[2];
    table[11] = entropy->y_mode_prob[3];
    table[12] = entropy->uv_mode_prob[0];
    table[13] = entropy->uv_mode_prob[1];
    table[14] = entropy->uv_mode_prob[2];

    /* MV probabilities x+y: short, sign, size 8-9 */
    table[16] = entropy->mv_prob[1][0];
    table[17] = entropy->mv_prob[0][0];
    table[18] = entropy->mv_prob[1][1];
    table[19] = entropy->mv_prob[0][1];
    table[20] = entropy->mv_prob[1][17];
    table[21] = entropy->mv_prob[1][18];
    table[22] = entropy->mv_prob[0][17];
    table[23] = entropy->mv_prob[0][18];
    {
        RK_S32 i, j, k, l;
        /* MV X size */
        for (i = 0; i < 8; i++)
            table[24 + i] = entropy->mv_prob[1][9 + i];

        /* MV Y size */
        for (i = 0; i < 8; i++)
            table[32 + i] = entropy->mv_prob[0][9 + i];

        /* MV X short tree */
        for (i = 0; i < 7; i++)
            table[40 + i] = entropy->mv_prob[1][2 + i];

        /* MV Y short tree */
        for (i = 0; i < 7; i++)
            table[48 + i] = entropy->mv_prob[0][2 + i];

        /* Update the ASIC table when needed. */
        if (entropy->update_coeff_prob_flag) {
            table += 56;
            /* DCT coeff probabilities 0-2, two fields per line. */
            for (i = 0; i < 4; i++)
                for (j = 0; j < 8; j++)
                    for (k = 0; k < 3; k++) {
                        for (l = 0; l < 3; l++) {
                            *table++ = entropy->coeff_prob[i][j][k][l];
                        }
                        *table++ = 0;
                    }

            /* ASIC second probability table in ext mem.
             * DCT coeff probabilities 4 5 6 7 8 9 10 3 on each line.
             * coeff 3 was moved from first table to second so it is last. */
            for (i = 0; i < 4; i++)
                for (j = 0; j < 8; j++)
                    for (k = 0; k < 3; k++) {
                        for (l = 4; l < 11; l++) {
                            *table++ = entropy->coeff_prob[i][j][k][l];
                        }
                        *table++ = entropy->coeff_prob[i][j][k][3];
                    }
        }
    }
    table = mpp_buffer_get_ptr(buffers->hw_cabac_table_buf);
    if (entropy->update_coeff_prob_flag)
        vp8e_swap_endian((RK_U32 *) table, 56 + 8 * 48 + 8 * 96);
    else
        vp8e_swap_endian((RK_U32 *) table, 56);

    mpp_buffer_sync_end(buffers->hw_cabac_table_buf);

    return MPP_OK;
}